

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucs.h
# Opt level: O0

unsigned_short MeCab::utf8_to_ucs2(char *begin,char *end,size_t *mblen)

{
  ulong uVar1;
  size_t len;
  size_t *mblen_local;
  char *end_local;
  char *begin_local;
  ushort local_2;
  
  uVar1 = (long)end - (long)begin;
  if ((byte)*begin < 0x80) {
    *mblen = 1;
    local_2 = (ushort)(byte)*begin;
  }
  else if ((uVar1 < 2) || (((int)*begin & 0xe0U) != 0xc0)) {
    if ((uVar1 < 3) || (((int)*begin & 0xf0U) != 0xe0)) {
      if ((uVar1 < 4) || (((int)*begin & 0xf8U) != 0xf0)) {
        if ((uVar1 < 5) || (((int)*begin & 0xfcU) != 0xf8)) {
          if ((uVar1 < 6) || (((int)*begin & 0xfeU) != 0xfc)) {
            *mblen = 1;
            local_2 = 0;
          }
          else {
            *mblen = 6;
            local_2 = 0;
          }
        }
        else {
          *mblen = 5;
          local_2 = 0;
        }
      }
      else {
        *mblen = 4;
        local_2 = 0;
      }
    }
    else {
      *mblen = 3;
      local_2 = (short)*begin << 0xc | ((short)begin[1] & 0x3fU) << 6 | (short)begin[2] & 0x3fU;
    }
  }
  else {
    *mblen = 2;
    local_2 = ((short)*begin & 0x1fU) << 6 | (short)begin[1] & 0x3fU;
  }
  return local_2;
}

Assistant:

inline unsigned short utf8_to_ucs2(const char *begin, const char *end,
                                   size_t*  mblen) {
  const size_t len = end - begin;

  if (static_cast<unsigned char>(begin[0]) < 0x80) {
    *mblen = 1;
    return static_cast<unsigned char>(begin[0]);

  } else if (len >= 2 && (begin[0] & 0xe0) == 0xc0) {
    *mblen = 2;
    return((begin[0] & 0x1f) << 6) |(begin[1] & 0x3f);

  } else if (len >= 3 && (begin[0] & 0xf0) == 0xe0) {
    *mblen = 3;
    return ((begin[0] & 0x0f) << 12) |
        ((begin[1] & 0x3f) << 6) |(begin[2] & 0x3f);

    /* belows are out of UCS2 */
  } else if (len >= 4 && (begin[0] & 0xf8) == 0xf0) {
    *mblen = 4;
    return 0;

  } else if (len >= 5 && (begin[0] & 0xfc) == 0xf8) {
    *mblen = 5;
    return 0;

  } else if (len >= 6 && (begin[0] & 0xfe) == 0xfc) {
    *mblen = 6;
    return 0;

  } else {
    *mblen = 1;
    return 0;
  }
}